

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O0

unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_> __thiscall
groundupdbext::EmbeddedDatabase::Impl::createEmpty(Impl *this,string *dbname)

{
  bool bVar1;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string dbfolder;
  path local_78;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string basedir;
  string *dbname_local;
  
  basedir.field_2._8_8_ = dbname;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,".groundupdb",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
             ,auto_format);
  bVar1 = std::filesystem::exists(&local_78);
  std::filesystem::__cxx11::path::~path(&local_78);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              ((path *)((long)&dbfolder.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               auto_format);
    std::filesystem::create_directory((path *)((long)&dbfolder.field_2 + 8));
    std::filesystem::__cxx11::path::~path((path *)((long)&dbfolder.field_2 + 8));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_e8 + 8)
                 ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,"/")
  ;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_e8 + 8)
                 ,dbname);
  std::__cxx11::string::~string((string *)(local_e8 + 8));
  std::
  make_unique<groundupdbext::EmbeddedDatabase::Impl,std::__cxx11::string&,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,dbname);
  std::unique_ptr<groundupdb::IDatabase,std::default_delete<groundupdb::IDatabase>>::
  unique_ptr<groundupdbext::EmbeddedDatabase::Impl,std::default_delete<groundupdbext::EmbeddedDatabase::Impl>,void>
            ((unique_ptr<groundupdb::IDatabase,std::default_delete<groundupdb::IDatabase>> *)this,
             (unique_ptr<groundupdbext::EmbeddedDatabase::Impl,_std::default_delete<groundupdbext::EmbeddedDatabase::Impl>_>
              *)local_e8);
  std::
  unique_ptr<groundupdbext::EmbeddedDatabase::Impl,_std::default_delete<groundupdbext::EmbeddedDatabase::Impl>_>
  ::~unique_ptr((unique_ptr<groundupdbext::EmbeddedDatabase::Impl,_std::default_delete<groundupdbext::EmbeddedDatabase::Impl>_>
                 *)local_e8);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_38);
  return (__uniq_ptr_data<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>,_true,_true>
          )(__uniq_ptr_data<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>,_true,_true>
            )this;
}

Assistant:

const std::unique_ptr<IDatabase> EmbeddedDatabase::Impl::createEmpty(std::string dbname) {
  std::string basedir(".groundupdb");
  if (!fs::exists(basedir)) {
      fs::create_directory(basedir);
  }
  std::string dbfolder(basedir + "/" + dbname);
  return std::make_unique<EmbeddedDatabase::Impl>(dbname,dbfolder);
}